

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

Value * __thiscall
soul::heart::ArrayElement::getAsConstant(Value *__return_storage_ptr__,ArrayElement *this)

{
  Expression *pEVar1;
  size_t sVar2;
  Value indexValue;
  Value parentValue;
  Value local_d0;
  Value local_90;
  ArrayWithPreallocation<unsigned_long,_4UL> local_50;
  
  (*(((this->parent).object)->super_Object)._vptr_Object[7])(&local_90);
  if ((local_90.type.category != invalid) &&
     ((local_90.type.category != array || (local_90.type.boundingSize != 0)))) {
    pEVar1 = (this->dynamicIndex).object;
    sVar2 = this->fixedStartIndex;
    if (this->fixedEndIndex - sVar2 != 1 && pEVar1 == (Expression *)0x0) {
      soul::Value::getSlice(__return_storage_ptr__,&local_90,sVar2,this->fixedEndIndex);
      goto LAB_00246467;
    }
    if (pEVar1 == (Expression *)0x0) {
      SubElementPath::SubElementPath((SubElementPath *)&local_d0,sVar2);
      soul::Value::getSubElement(__return_storage_ptr__,&local_90,(SubElementPath *)&local_d0);
      ArrayWithPreallocation<unsigned_long,_4UL>::clear
                ((ArrayWithPreallocation<unsigned_long,_4UL> *)&local_d0);
      goto LAB_00246467;
    }
    pEVar1 = pool_ptr<soul::heart::Expression>::operator->(&this->dynamicIndex);
    (*(pEVar1->super_Object)._vptr_Object[7])(&local_d0,pEVar1);
    if (local_d0.type.category != invalid) {
      sVar2 = soul::Value::getAsInt64(&local_d0);
      if (-1 < (long)sVar2) {
        SubElementPath::SubElementPath((SubElementPath *)&local_50,sVar2);
        soul::Value::getSubElement(__return_storage_ptr__,&local_90,(SubElementPath *)&local_50);
        ArrayWithPreallocation<unsigned_long,_4UL>::clear(&local_50);
        soul::Value::~Value(&local_d0);
        goto LAB_00246467;
      }
    }
    soul::Value::~Value(&local_d0);
  }
  (__return_storage_ptr__->type).structure.object = (Structure *)0x0;
  (__return_storage_ptr__->allocatedData).allocatedSize = 0;
  (__return_storage_ptr__->type).category = invalid;
  (__return_storage_ptr__->type).arrayElementCategory = invalid;
  (__return_storage_ptr__->type).isRef = false;
  (__return_storage_ptr__->type).isConstant = false;
  (__return_storage_ptr__->type).primitiveType = invalid;
  (__return_storage_ptr__->type).boundingSize = 0;
  (__return_storage_ptr__->type).arrayElementBoundingSize = 0;
  (__return_storage_ptr__->allocatedData).allocatedData.items =
       (uchar *)(__return_storage_ptr__->allocatedData).allocatedData.space;
  (__return_storage_ptr__->allocatedData).allocatedData.numActive = 0;
  (__return_storage_ptr__->allocatedData).allocatedData.numAllocated = 8;
LAB_00246467:
  soul::Value::~Value(&local_90);
  return __return_storage_ptr__;
}

Assistant:

Value getAsConstant() const override
        {
            auto parentValue = parent->getAsConstant();

            if (parentValue.isValid() && ! parentValue.getType().isUnsizedArray())
            {
                if (isSlice())
                    return parentValue.getSlice (fixedStartIndex, fixedEndIndex);

                if (dynamicIndex == nullptr)
                    return parentValue.getSubElement (fixedStartIndex);

                auto indexValue = dynamicIndex->getAsConstant();

                if (indexValue.isValid())
                {
                    auto index = indexValue.getAsInt64();

                    if (index >= 0)
                        return parentValue.getSubElement ((size_t) index);
                }
            }

            return {};
        }